

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SO3QuaternionTest.cpp
# Opt level: O2

void __thiscall RandomSO3IsInM::test_method(RandomSO3IsInM *this)

{
  Index size;
  RandomReturnType local_2a0;
  shared_count sStack_290;
  char *local_288;
  char *local_280;
  undefined **local_278;
  undefined1 local_270;
  undefined8 *local_268;
  char **local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  SO3<mnf::ExpMapQuaternion> S;
  Point y;
  
  mnf::SO3<mnf::ExpMapQuaternion>::SO3(&S);
  mnf::Manifold::createRandomPoint(1.0);
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_208,0x5b);
  local_2a0.m_rows.m_value._0_1_ = mnf::Point::isInM(1e-12);
  local_2a0._8_8_ = 0;
  sStack_290.pi_ = (sp_counted_base *)0x0;
  local_288 = "y.isInM()";
  local_280 = "";
  local_270 = 0;
  local_278 = &PTR__lazy_ostream_00153be0;
  local_268 = &boost::unit_test::lazy_ostream::inst;
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_220 = "";
  local_260 = &local_288;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_290);
  size = mnf::Manifold::representationDim();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Random(&local_2a0,size);
  mnf::SubPoint::value();
  Eigen::internal::
  call_assignment<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)&local_278,
             &local_2a0);
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_238,0x5d);
  local_2a0.m_rows.m_value._0_1_ = mnf::Point::isInM(1e-12);
  local_2a0.m_rows.m_value._0_1_ = (byte)local_2a0.m_rows.m_value ^ 1;
  local_2a0._8_8_ = 0;
  sStack_290.pi_ = (sp_counted_base *)0x0;
  local_288 = "!y.isInM()";
  local_280 = "";
  local_270 = 0;
  local_278 = &PTR__lazy_ostream_00153be0;
  local_268 = &boost::unit_test::lazy_ostream::inst;
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_250 = "";
  local_260 = &local_288;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_290);
  mnf::Point::~Point(&y);
  mnf::SO3<mnf::ExpMapQuaternion>::~SO3(&S);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(RandomSO3IsInM)
{
  SO3<ExpMapQuaternion> S;
  Point y = S.createRandomPoint();
  BOOST_CHECK(y.isInM());
  y.value() = Eigen::VectorXd::Random(S.representationDim());
  BOOST_CHECK(!y.isInM());
}